

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O3

Move * __thiscall
puppup::Game::thinkyThinky(Move *__return_storage_ptr__,Game *this,idx max_moves,idx samples)

{
  Gaddag *pGVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  long lVar6;
  State *pSVar7;
  idx *piVar8;
  vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> moves;
  set<puppup::movegen::Move,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
  moves_set;
  idx local_1088 [514];
  __normal_iterator<puppup::movegen::Move_*,_std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>_>
  local_78;
  __normal_iterator<puppup::movegen::Move_*,_std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>_>
  local_70;
  long local_68;
  _Rb_tree<puppup::movegen::Move,_puppup::movegen::Move,_std::_Identity<puppup::movegen::Move>,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
  local_60;
  
  pGVar1 = this->gaddag_;
  pSVar7 = &this->state_;
  piVar8 = local_1088;
  for (lVar6 = 0x201; lVar6 != 0; lVar6 = lVar6 + -1) {
    *piVar8 = pSVar7->score;
    pSVar7 = (State *)&pSVar7->board;
    piVar8 = piVar8 + 1;
  }
  movegen::genFromBoard(&local_78,pGVar1,0);
  std::
  set<puppup::movegen::Move,std::greater<puppup::movegen::Move>,std::allocator<puppup::movegen::Move>>
  ::
  set<__gnu_cxx::__normal_iterator<puppup::movegen::Move*,std::vector<puppup::movegen::Move,std::allocator<puppup::movegen::Move>>>>
            ((set<puppup::movegen::Move,std::greater<puppup::movegen::Move>,std::allocator<puppup::movegen::Move>>
              *)&local_60,local_78,local_70);
  __return_storage_ptr__->blanks =
       *(idx *)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 2);
  p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
  p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_left;
  p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_right;
  __return_storage_ptr__->score =
       *(idx *)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1);
  __return_storage_ptr__->word = (idx)p_Var2;
  __return_storage_ptr__->cursor = (idx)p_Var3;
  __return_storage_ptr__->step = (idx)p_Var4;
  for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    movegen::print((Move *)(p_Var5 + 1),&this->state_,this->gaddag_);
    max_moves = max_moves + -1;
    if (max_moves == 0) break;
  }
  std::
  _Rb_tree<puppup::movegen::Move,_puppup::movegen::Move,_std::_Identity<puppup::movegen::Move>,_std::greater<puppup::movegen::Move>,_std::allocator<puppup::movegen::Move>_>
  ::~_Rb_tree(&local_60);
  if (local_78._M_current != (Move *)0x0) {
    operator_delete(local_78._M_current,local_68 - (long)local_78._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

movegen::Move thinkyThinky(idx max_moves = 10, const idx samples = 50) {
        auto moves = movegen::genFromBoard(racks_[turn_], gaddag_, state_);
        std::set<movegen::Move, std::greater<movegen::Move>> moves_set(
            moves.begin(), moves.end());
        movegen::Move best = *moves_set.begin();
        // auto best_prob = -9999999999LL;
        // idx maxfails = samples;
        for (auto& mov : moves_set) {
            movegen::print(mov, state_, gaddag_);
            /*
            Game other(*this);
            const auto prob = other.winProbability(samples, mov, maxfails);
            if (prob > best_prob) {
                best = mov;
                best_prob = prob;
                maxfails = samples - prob;
            }
            */

            --max_moves;
            if (max_moves == 0) break;
        }
        /*
        {
            Game other(*this);
            setRack(turn_, empty_rack);
            genRack(turn_);
            movegen::Move change = {0, -1, 0, 0, 0};
            movegen::print(change, state_, gaddag_);
            const auto prob = other.winProbability(samples, change, maxfails);
            if (prob > best_prob) {
                return change;
            }
        }
        */
        return best;
    }